

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O2

void fm_getAABB(uint vcount,float *points,uint pstride,float *bmin,float *bmax)

{
  float *pfVar1;
  uint uVar2;
  uchar *source;
  
  pfVar1 = points + 2;
  *bmin = *points;
  bmin[1] = points[1];
  bmin[2] = points[2];
  *bmax = *points;
  bmax[1] = points[1];
  bmax[2] = points[2];
  uVar2 = 1;
  while( true ) {
    pfVar1 = (float *)((long)pfVar1 + (ulong)pstride);
    if (vcount <= uVar2) break;
    if (pfVar1[-2] < *bmin) {
      *bmin = pfVar1[-2];
    }
    if (pfVar1[-1] < bmin[1]) {
      bmin[1] = pfVar1[-1];
    }
    if (*pfVar1 < bmin[2]) {
      bmin[2] = *pfVar1;
    }
    if (*bmax < pfVar1[-2]) {
      *bmax = pfVar1[-2];
    }
    if (bmax[1] < pfVar1[-1]) {
      bmax[1] = pfVar1[-1];
    }
    if (bmax[2] < *pfVar1) {
      bmax[2] = *pfVar1;
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void fm_getAABB(unsigned int vcount,const float *points,unsigned int pstride,float *bmin,float *bmax)
{

  const unsigned char *source = (const unsigned char *) points;

	bmin[0] = points[0];
	bmin[1] = points[1];
	bmin[2] = points[2];

	bmax[0] = points[0];
	bmax[1] = points[1];
	bmax[2] = points[2];


  for (unsigned int i=1; i<vcount; i++)
  {
  	source+=pstride;
  	const float *p = (const float *) source;

  	if ( p[0] < bmin[0] ) bmin[0] = p[0];
  	if ( p[1] < bmin[1] ) bmin[1] = p[1];
  	if ( p[2] < bmin[2] ) bmin[2] = p[2];

		if ( p[0] > bmax[0] ) bmax[0] = p[0];
		if ( p[1] > bmax[1] ) bmax[1] = p[1];
		if ( p[2] > bmax[2] ) bmax[2] = p[2];

  }
}